

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detect.cpp
# Opt level: O1

void processInput(string *inpFilePath,int insSz,int stdDev,int readLen,double coverage,
                 string *outFolderPath,bool verbose,uint threads)

{
  vector<std::thread,_std::allocator<std::thread>_> *pvVar1;
  pointer pcVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  pointer psVar5;
  pointer psVar6;
  pointer psVar7;
  pointer ptVar8;
  bool bVar9;
  RefVector *__x;
  mapped_type *pmVar10;
  int iVar11;
  int i;
  pointer pRVar12;
  _Tuple_impl<1UL,_int,_int> *p_Var13;
  pointer psVar14;
  bool verbose_local;
  BamReader br;
  int bpRegion;
  vector<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
  tasks;
  element_type *local_318;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_310;
  element_type *local_308;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_300;
  element_type *local_2f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2f0;
  element_type *local_2e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2e0;
  element_type *local_2d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2d0;
  element_type *local_2c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2c0;
  element_type *local_2b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2b0;
  element_type *local_2a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2a0;
  shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outFolderTask;
  shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  inpFileTask;
  shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>_>
  exRegionsTask;
  shared_ptr<transwarp::value_task<bool>_> verboseTask;
  shared_ptr<transwarp::value_task<int>_> bpRegionTask;
  shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
  mapTask;
  shared_ptr<transwarp::value_task<std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>_>
  refTask;
  shared_ptr<transwarp::value_task<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  regionTask;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  inpRegions;
  RefVector ref;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
  inpRegion;
  shared_ptr<_157937eb_> processTask;
  string inpIntervalsFilePath;
  string excludeFilePath;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  revRefMap;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>
  exRegions;
  parallel executor;
  
  INTRA_ALIGN_SCORE = readLen / 2;
  MIN_SC_CLUSTER_SUPPORT = 1;
  if (1 < (int)(coverage / 10.0)) {
    MIN_SC_CLUSTER_SUPPORT = (int)(coverage / 10.0);
  }
  exRegions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &exRegions._M_t._M_impl.super__Rb_tree_header._M_header;
  exRegions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  exRegions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  exRegions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  MIN_SPLIT_SUPPORT = MIN_SC_CLUSTER_SUPPORT;
  MIN_DISC_CLUSTER_SUPPORT = MIN_SC_CLUSTER_SUPPORT;
  verbose_local = verbose;
  exRegions._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       exRegions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::operator+(&excludeFilePath,outFolderPath,&excludeFileName_abi_cxx11_);
  openExcludeRegions(&excludeFilePath,&exRegions);
  inpRegions.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  inpRegions.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  inpRegions.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::operator+(&inpIntervalsFilePath,outFolderPath,&inpIntervalFileName_abi_cxx11_);
  openInputIntervals(&inpIntervalsFilePath,&inpRegions);
  BamTools::BamReader::BamReader(&br);
  bVar9 = openInput(inpFilePath,&br);
  if (bVar9) {
    __x = BamTools::BamReader::GetReferenceData(&br);
    std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::vector(&ref,__x);
    BamTools::BamReader::Close(&br);
    revRefMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &revRefMap._M_t._M_impl.super__Rb_tree_header._M_header;
    revRefMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    iVar11 = 0;
    revRefMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    revRefMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    revRefMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         revRefMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (ref.super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>._M_impl.
        super__Vector_impl_data._M_start !=
        ref.super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pvVar1 = &executor.pool_.threads_;
      pRVar12 = ref.super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        pcVar2 = (pRVar12->RefName)._M_dataplus._M_p;
        executor.super_executor._vptr_executor = (_func_int **)pvVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&executor,pcVar2,pcVar2 + (pRVar12->RefName)._M_string_length);
        executor.pool_.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = pRVar12->RefLength;
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::operator[](&revRefMap,(key_type *)&executor);
        *pmVar10 = iVar11;
        if ((vector<std::thread,_std::allocator<std::thread>_> *)
            executor.super_executor._vptr_executor != pvVar1) {
          operator_delete(executor.super_executor._vptr_executor);
        }
        pRVar12 = pRVar12 + 1;
        iVar11 = iVar11 + 1;
      } while (pRVar12 !=
               ref.super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>._M_impl
               .super__Vector_impl_data._M_finish);
    }
    iVar11 = 0;
    do {
      headerOutput(outFolderPath,iVar11);
      iVar11 = iVar11 + 1;
    } while (iVar11 != 3);
    bpRegion = stdDev * 3 + insSz;
    executor.super_executor._vptr_executor = (_func_int **)&PTR__parallel_001ea848;
    transwarp::detail::thread_pool::thread_pool(&executor.pool_,(ulong)threads);
    ptVar8 = inpRegions.
             super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    tasks.
    super__Vector_base<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tasks.
    super__Vector_base<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    tasks.
    super__Vector_base<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (inpRegions.
        super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        inpRegions.
        super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      p_Var13 = (_Tuple_impl<1UL,_int,_int> *)
                inpRegions.
                super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        inpRegion.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
        .super__Tuple_impl<1UL,_int,_int> = *p_Var13;
        inpRegion.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
        ._M_head_impl._M_dataplus._M_p =
             (pointer)&inpRegion.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                       ._M_head_impl.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)
                   &inpRegion.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                   ,p_Var13[1],(long)p_Var13[2] + (long)p_Var13[1]);
        transwarp::make_value_task<std::tuple<std::__cxx11::string,int,int>&>
                  ((transwarp *)&regionTask,&inpRegion);
        transwarp::
        make_value_task<std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>&>
                  ((transwarp *)&refTask,&ref);
        transwarp::
        make_value_task<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>&>
                  ((transwarp *)&mapTask,&revRefMap);
        transwarp::make_value_task<int&>((transwarp *)&bpRegionTask,&bpRegion);
        transwarp::make_value_task<bool_const&>((transwarp *)&verboseTask,&verbose_local);
        transwarp::
        make_value_task<std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>&>
                  ((transwarp *)&exRegionsTask,&exRegions);
        transwarp::make_value_task<std::__cxx11::string_const&>
                  ((transwarp *)&inpFileTask,inpFilePath);
        transwarp::make_value_task<std::__cxx11::string_const&>
                  ((transwarp *)&outFolderTask,outFolderPath);
        local_2a8 = regionTask.
                    super___shared_ptr<transwarp::value_task<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
        local_2a0 = regionTask.
                    super___shared_ptr<transwarp::value_task<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
        if (regionTask.
            super___shared_ptr<transwarp::value_task<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (regionTask.
             super___shared_ptr<transwarp::value_task<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (regionTask.
                  super___shared_ptr<transwarp::value_task<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (regionTask.
             super___shared_ptr<transwarp::value_task<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (regionTask.
                  super___shared_ptr<transwarp::value_task<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_2b8 = refTask.
                    super___shared_ptr<transwarp::value_task<std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
        local_2b0 = refTask.
                    super___shared_ptr<transwarp::value_task<std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
        if (refTask.
            super___shared_ptr<transwarp::value_task<std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (refTask.
             super___shared_ptr<transwarp::value_task<std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (refTask.
                  super___shared_ptr<transwarp::value_task<std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (refTask.
             super___shared_ptr<transwarp::value_task<std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (refTask.
                  super___shared_ptr<transwarp::value_task<std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_2c8 = mapTask.
                    super___shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
        local_2c0 = mapTask.
                    super___shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
        if (mapTask.
            super___shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (mapTask.
             super___shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (mapTask.
                  super___shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (mapTask.
             super___shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (mapTask.
                  super___shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_2d8 = bpRegionTask.
                    super___shared_ptr<transwarp::value_task<int>,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
        local_2d0 = bpRegionTask.
                    super___shared_ptr<transwarp::value_task<int>,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
        if (bpRegionTask.super___shared_ptr<transwarp::value_task<int>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (bpRegionTask.super___shared_ptr<transwarp::value_task<int>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (bpRegionTask.
                  super___shared_ptr<transwarp::value_task<int>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (bpRegionTask.super___shared_ptr<transwarp::value_task<int>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (bpRegionTask.
                  super___shared_ptr<transwarp::value_task<int>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_2e8 = verboseTask.
                    super___shared_ptr<transwarp::value_task<bool>,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
        local_2e0 = verboseTask.
                    super___shared_ptr<transwarp::value_task<bool>,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
        if (verboseTask.super___shared_ptr<transwarp::value_task<bool>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (verboseTask.super___shared_ptr<transwarp::value_task<bool>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (verboseTask.
                  super___shared_ptr<transwarp::value_task<bool>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (verboseTask.super___shared_ptr<transwarp::value_task<bool>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (verboseTask.
                  super___shared_ptr<transwarp::value_task<bool>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_2f8 = exRegionsTask.
                    super___shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
        local_2f0 = exRegionsTask.
                    super___shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
        if (exRegionsTask.
            super___shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (exRegionsTask.
             super___shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (exRegionsTask.
                  super___shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (exRegionsTask.
             super___shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (exRegionsTask.
                  super___shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_308 = inpFileTask.
                    super___shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
        local_300 = inpFileTask.
                    super___shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
        if (inpFileTask.
            super___shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (inpFileTask.
             super___shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (inpFileTask.
                  super___shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (inpFileTask.
             super___shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (inpFileTask.
                  super___shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_318 = outFolderTask.
                    super___shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
        local_310 = outFolderTask.
                    super___shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
        if (outFolderTask.
            super___shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (outFolderTask.
             super___shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (outFolderTask.
                  super___shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (outFolderTask.
             super___shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (outFolderTask.
                  super___shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        transwarp::
        make_task<transwarp::consume_type,void(&)(std::tuple<std::__cxx11::string,int,int>const&,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>const&,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const&,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&),transwarp::value_task<std::tuple<std::__cxx11::string,int,int>>,transwarp::value_task<std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>>,transwarp::value_task<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>,transwarp::value_task<int>,transwarp::value_task<bool>,transwarp::value_task<std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>>,transwarp::value_task<std::__cxx11::string>,transwarp::value_task<std::__cxx11::string>>
                  (&processTask,parallelProcess,&local_2a8,&local_2b8,&local_2c8,&local_2d8,
                   &local_2e8,&local_2f8,&local_308,&local_318);
        if (local_310 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_310);
        }
        if (local_300 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_300);
        }
        if (local_2f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2f0);
        }
        if (local_2e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2e0);
        }
        if (local_2d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2d0);
        }
        if (local_2c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c0);
        }
        if (local_2b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2b0);
        }
        if (local_2a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2a0);
        }
        std::
        vector<std::shared_ptr<transwarp::task<void>>,std::allocator<std::shared_ptr<transwarp::task<void>>>>
        ::
        emplace_back<std::shared_ptr<transwarp::task_impl<transwarp::consume_type,void(*)(std::tuple<std::__cxx11::string,int,int>const&,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>const&,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const&,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&),std::tuple<std::__cxx11::string,int,int>,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::__cxx11::string,std::__cxx11::string>>&>
                  ((vector<std::shared_ptr<transwarp::task<void>>,std::allocator<std::shared_ptr<transwarp::task<void>>>>
                    *)&tasks,&processTask);
        if (processTask.super___shared_ptr<_ad2835a3_>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (processTask.super___shared_ptr<_ad2835a3_>._M_refcount._M_pi);
        }
        if (outFolderTask.
            super___shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (outFolderTask.
                     super___shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if (inpFileTask.
            super___shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (inpFileTask.
                     super___shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if (exRegionsTask.
            super___shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (exRegionsTask.
                     super___shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if (verboseTask.super___shared_ptr<transwarp::value_task<bool>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (verboseTask.
                     super___shared_ptr<transwarp::value_task<bool>,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (bpRegionTask.super___shared_ptr<transwarp::value_task<int>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (bpRegionTask.
                     super___shared_ptr<transwarp::value_task<int>,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (mapTask.
            super___shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (mapTask.
                     super___shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if (refTask.
            super___shared_ptr<transwarp::value_task<std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (refTask.
                     super___shared_ptr<transwarp::value_task<std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if (regionTask.
            super___shared_ptr<transwarp::value_task<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (regionTask.
                     super___shared_ptr<transwarp::value_task<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)inpRegion.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               ._M_head_impl._M_dataplus._M_p !=
            &inpRegion.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             ._M_head_impl.field_2) {
          operator_delete(inpRegion.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                          ._M_head_impl._M_dataplus._M_p);
        }
        p_Var13 = p_Var13 + 5;
      } while (p_Var13 != (_Tuple_impl<1UL,_int,_int> *)ptVar8);
    }
    psVar7 = tasks.
             super__Vector_base<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    psVar5 = tasks.
             super__Vector_base<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar6 = tasks.
             super__Vector_base<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (tasks.
        super__Vector_base<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        tasks.
        super__Vector_base<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      psVar14 = tasks.
                super__Vector_base<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        peVar3 = (psVar14->super___shared_ptr<transwarp::task<void>,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        p_Var4 = (psVar14->super___shared_ptr<transwarp::task<void>,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          }
        }
        (*(peVar3->super_itask)._vptr_itask[0x1c])(peVar3,&executor);
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
        }
        psVar14 = psVar14 + 1;
        psVar5 = tasks.
                 super__Vector_base<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        psVar6 = tasks.
                 super__Vector_base<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      } while (psVar14 != psVar7);
    }
    for (; psVar7 = tasks.
                    super__Vector_base<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
        psVar5 != tasks.
                  super__Vector_base<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; psVar5 = psVar5 + 1) {
      peVar3 = (psVar5->super___shared_ptr<transwarp::task<void>,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      p_Var4 = (psVar5->super___shared_ptr<transwarp::task<void>,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        }
      }
      tasks.
      super__Vector_base<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = psVar6;
      (*(peVar3->super_itask)._vptr_itask[0x37])();
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
      }
      psVar6 = tasks.
               super__Vector_base<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      tasks.
      super__Vector_base<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = psVar7;
    }
    tasks.
    super__Vector_base<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar6;
    std::
    vector<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
    ::~vector(&tasks);
    executor.super_executor._vptr_executor = (_func_int **)&PTR__parallel_001ea848;
    transwarp::detail::thread_pool::~thread_pool(&executor.pool_);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~_Rb_tree(&revRefMap._M_t);
    std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::~vector(&ref);
  }
  BamTools::BamReader::~BamReader(&br);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)inpIntervalsFilePath._M_dataplus._M_p != &inpIntervalsFilePath.field_2) {
    operator_delete(inpIntervalsFilePath._M_dataplus._M_p);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  ::~vector(&inpRegions);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)excludeFilePath._M_dataplus._M_p != &excludeFilePath.field_2) {
    operator_delete(excludeFilePath._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>
  ::~_Rb_tree(&exRegions._M_t);
  return;
}

Assistant:

void processInput(const std::string &inpFilePath, const int insSz, const int stdDev, const int readLen, const double coverage, const std::string &outFolderPath, const bool verbose, const unsigned int threads)
{
	INTRA_ALIGN_SCORE = readLen / 2;
	MIN_SC_CLUSTER_SUPPORT = MIN_SPLIT_SUPPORT = MIN_DISC_CLUSTER_SUPPORT = std::max(1, (int)(coverage / 10));

	std::map<std::string, std::vector<std::pair<long, long>>> exRegions;
	std::string excludeFilePath = outFolderPath + excludeFileName;
	openExcludeRegions(excludeFilePath, exRegions);

	std::vector<std::tuple<std::string, int, int>> inpRegions;
	std::string inpIntervalsFilePath = outFolderPath + inpIntervalFileName;
	openInputIntervals(inpIntervalsFilePath, inpRegions);

	BamTools::BamReader br;
	if (!openInput(inpFilePath, br))
	{
		return;
	}

	BamTools::RefVector ref = br.GetReferenceData();

	br.Close();

	std::map<std::string, int> revRefMap;

	int refCo = 0;
	for (auto d : ref)
	{
		revRefMap[d.RefName] = refCo;
		refCo++;
	}

	for (int i = 0; i < 3; i++)
		headerOutput(outFolderPath, i);

	int bpRegion = insSz + (3 * stdDev);

	transwarp::parallel executor{threads};

	std::vector<std::shared_ptr<transwarp::task<void>>> tasks;

	for (auto inpRegion : inpRegions)
	{
		auto regionTask = transwarp::make_value_task(inpRegion);
		auto refTask = transwarp::make_value_task(ref);
		auto mapTask = transwarp::make_value_task(revRefMap);
		auto bpRegionTask = transwarp::make_value_task(bpRegion);
		auto verboseTask = transwarp::make_value_task(verbose);
		auto exRegionsTask = transwarp::make_value_task(exRegions);
		auto inpFileTask = transwarp::make_value_task(inpFilePath);
		auto outFolderTask = transwarp::make_value_task(outFolderPath);

		auto processTask = transwarp::make_task(transwarp::consume, parallelProcess, regionTask, refTask, mapTask, bpRegionTask, verboseTask, exRegionsTask, inpFileTask, outFolderTask);

		tasks.emplace_back(processTask);
	}

	for (auto task : tasks)
	{
		task->schedule(executor);
	}

	for (auto task : tasks)
	{
		task->get();
	}
}